

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-pound.c
# Opt level: O1

int run_benchmark_pipe_pound_100(void)

{
  void *in_R9;
  
  pound_it(100,"pipe",pipe_do_setup,pipe_do_connect,pipe_make_connect,in_R9);
  return 0;
}

Assistant:

BENCHMARK_IMPL(pipe_pound_100) {
  return pound_it(100,
                  "pipe",
                  pipe_do_setup,
                  pipe_do_connect,
                  pipe_make_connect,
                  NULL);
}